

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_suite.cpp
# Opt level: O2

void test_one_object(void)

{
  undefined4 local_170;
  value local_16c;
  view_type skipped;
  reader reader;
  
  skipped._M_str = "{\"skip\": \"me\"}";
  skipped._M_len = 0xe;
  trial::protocol::json::basic_reader<char>::basic_reader(&reader,&skipped);
  skipped = trial::protocol::json::partial::skip<char>(&reader);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[15]>
            ("skipped","R\"({\"skip\": \"me\"})\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/skip_suite.cpp"
             ,0x1d,"void test_one_object()",&skipped,"{\"skip\": \"me\"}");
  local_16c = reader.decoder.current.code;
  local_170 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/skip_suite.cpp"
             ,0x1e,"void test_one_object()",&local_16c,&local_170);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&reader.stack);
  return;
}

Assistant:

void test_one_object()
{
    json::reader reader(R"({"skip": "me"})");
    auto skipped = json::partial::skip(reader);
    TRIAL_PROTOCOL_TEST_EQUAL(skipped, R"({"skip": "me"})");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}